

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void Curl_http_method(Curl_easy *data,connectdata *conn,char **method,Curl_HttpReq *reqp)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  
  bVar1 = (data->state).httpreq;
  bVar2 = bVar1;
  if (((conn->handler->protocol & 7) != 0) && (bVar2 = 4, ((data->state).field_0x74e & 0x10) == 0))
  {
    bVar2 = bVar1;
  }
  pcVar3 = (data->set).str[6];
  if (pcVar3 == (char *)0x0) {
    if (((data->req).field_0xbc & 0x10) == 0) {
      if ((byte)(bVar2 - 1) < 5) {
        pcVar3 = &DAT_0080a750 + *(int *)(&DAT_0080a750 + (ulong)(byte)(bVar2 - 1) * 4);
      }
      else {
        pcVar3 = "GET";
      }
    }
    else {
      pcVar3 = "HEAD";
    }
  }
  *method = pcVar3;
  *reqp = (uint)bVar2;
  return;
}

Assistant:

void Curl_http_method(struct Curl_easy *data, struct connectdata *conn,
                      const char **method, Curl_HttpReq *reqp)
{
  Curl_HttpReq httpreq = (Curl_HttpReq)data->state.httpreq;
  const char *request;
  if((conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_FTP)) &&
     data->state.upload)
    httpreq = HTTPREQ_PUT;

  /* Now set the 'request' pointer to the proper request string */
  if(data->set.str[STRING_CUSTOMREQUEST])
    request = data->set.str[STRING_CUSTOMREQUEST];
  else {
    if(data->req.no_body)
      request = "HEAD";
    else {
      DEBUGASSERT((httpreq >= HTTPREQ_GET) && (httpreq <= HTTPREQ_HEAD));
      switch(httpreq) {
      case HTTPREQ_POST:
      case HTTPREQ_POST_FORM:
      case HTTPREQ_POST_MIME:
        request = "POST";
        break;
      case HTTPREQ_PUT:
        request = "PUT";
        break;
      default: /* this should never happen */
      case HTTPREQ_GET:
        request = "GET";
        break;
      case HTTPREQ_HEAD:
        request = "HEAD";
        break;
      }
    }
  }
  *method = request;
  *reqp = httpreq;
}